

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatsoe.c
# Opt level: O3

int ecx_readIDNmap(ecx_contextt *context,uint16 slave,int *Osize,int *Isize)

{
  ushort uVar1;
  int iVar2;
  ulong uVar3;
  int psize;
  ec_SoEattributet SoEattribute;
  ec_SoEmappingt SoEmapping;
  
  *Isize = 0;
  *Osize = 0;
  psize = 0x84;
  iVar2 = ecx_SoEread(context,slave,'\0','@',0x18,&psize,&SoEmapping,700000);
  if (((0 < iVar2) && (3 < psize)) && ((ushort)(SoEmapping.currentlength - 2) < 0x80)) {
    uVar1 = SoEmapping.currentlength >> 1;
    *Osize = 0x10;
    uVar3 = 0;
    do {
      psize = 4;
      iVar2 = ecx_SoEread(context,slave,'\0','\x04',SoEmapping.idn[uVar3],&psize,&SoEattribute,
                          700000);
      if ((0 < iVar2) && (((uint)SoEattribute >> 0x12 & 1) == 0)) {
        *Osize = *Osize + (8 << (SoEattribute._2_1_ & 3));
      }
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
  }
  psize = 0x84;
  iVar2 = ecx_SoEread(context,slave,'\0','@',0x10,&psize,&SoEmapping,700000);
  if (((0 < iVar2) && (3 < psize)) && ((ushort)(SoEmapping.currentlength - 2) < 0x80)) {
    *Isize = 0x10;
    uVar3 = 0;
    do {
      psize = 4;
      iVar2 = ecx_SoEread(context,slave,'\0','\x04',SoEmapping.idn[uVar3],&psize,&SoEattribute,
                          700000);
      if ((0 < iVar2) && (((uint)SoEattribute >> 0x12 & 1) == 0)) {
        *Isize = *Isize + (8 << (SoEattribute._2_1_ & 3));
      }
      uVar3 = uVar3 + 1;
    } while (SoEmapping.currentlength >> 1 != uVar3);
  }
  if ((*Isize < 1) && (*Osize < 1)) {
    iVar2 = 0;
  }
  else {
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int ecx_readIDNmap(ecx_contextt *context, uint16 slave, int *Osize, int *Isize)
{
   int retVal = 0;
   int   wkc;
   int psize;
   uint16 entries, itemcount;
   ec_SoEmappingt     SoEmapping;
   ec_SoEattributet   SoEattribute;

   *Isize = 0;
   *Osize = 0;
   psize = sizeof(SoEmapping);
   /* read output mapping via SoE */
   wkc = ecx_SoEread(context, slave, 0, EC_SOE_VALUE_B, EC_IDN_MDTCONFIG, &psize, &SoEmapping, EC_TIMEOUTRXM);
   if ((wkc > 0) && (psize >= 4) && ((entries = etohs(SoEmapping.currentlength) / 2) > 0) && (entries <= EC_SOE_MAXMAPPING))
   {
      /* command word (uint16) is always mapped but not in list */
      *Osize = 16; 
      for (itemcount = 0 ; itemcount < entries ; itemcount++)
      {
         psize = sizeof(SoEattribute);
         /* read attribute of each IDN in mapping list */
         wkc = ecx_SoEread(context, slave, 0, EC_SOE_ATTRIBUTE_B, SoEmapping.idn[itemcount], &psize, &SoEattribute, EC_TIMEOUTRXM);
         if ((wkc > 0) && (!SoEattribute.list))
         {
            /* length : 0 = 8bit, 1 = 16bit .... */
            *Osize += (int)8 << SoEattribute.length;
         }   
      }   
   }   
   psize = sizeof(SoEmapping);
   /* read input mapping via SoE */
   wkc = ecx_SoEread(context, slave, 0, EC_SOE_VALUE_B, EC_IDN_ATCONFIG, &psize, &SoEmapping, EC_TIMEOUTRXM);
   if ((wkc > 0) && (psize >= 4) && ((entries = etohs(SoEmapping.currentlength) / 2) > 0) && (entries <= EC_SOE_MAXMAPPING))
   {
      /* status word (uint16) is always mapped but not in list */
      *Isize = 16; 
      for (itemcount = 0 ; itemcount < entries ; itemcount++)
      {
         psize = sizeof(SoEattribute);
         /* read attribute of each IDN in mapping list */
         wkc = ecx_SoEread(context, slave, 0, EC_SOE_ATTRIBUTE_B, SoEmapping.idn[itemcount], &psize, &SoEattribute, EC_TIMEOUTRXM);
         if ((wkc > 0) && (!SoEattribute.list))
         {
            /* length : 0 = 8bit, 1 = 16bit .... */
            *Isize += (int)8 << SoEattribute.length;
         }   
      }   
   }   

   /* found some I/O bits ? */
   if ((*Isize > 0) || (*Osize > 0))
   {
      retVal = 1;
   }
   return retVal;
}